

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O2

Node * __thiscall Parser::createReaderMacroOpNode(Parser *this,Token *t,Node *applied_to)

{
  Node *this_00;
  Node *applied_to_local;
  
  if (applied_to == (Node *)0x0) {
    this_00 = (Node *)0x0;
  }
  else {
    applied_to_local = applied_to;
    this_00 = (Node *)operator_new(0x30);
    Node::Node(this_00,this->ctx,t);
    this_00->nodeType = PNT_READER_MACRO;
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&this_00->children,&applied_to_local);
  }
  return this_00;
}

Assistant:

Node * createReaderMacroOpNode(Token & t, Node * applied_to)
  {
    if (!applied_to)
      return nullptr;

    Node * n = new Node(ctx, t);
    n->nodeType = PNT_READER_MACRO;
    n->children.push_back(applied_to);
    return n;
  }